

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::LogToAllLogfiles
               (LogSeverity severity,time_point *timestamp,char *message,size_t len)

{
  Logger *pLVar1;
  bool bVar2;
  undefined8 *puVar3;
  LogDestination *this;
  long lVar4;
  pointer __p;
  ulong uVar5;
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *this_00;
  _Head_base<0UL,_google::LogDestination_*,_false> local_38;
  
  if (fLB::FLAGS_logtostdout == '\x01') {
    if ((int)severity < fLI::FLAGS_stderrthreshold) {
      puVar3 = (undefined8 *)&stdout;
      goto LAB_00110b76;
    }
  }
  else if (fLB::FLAGS_logtostderr == '\0') {
    if (-1 < (int)severity) {
      this_00 = (__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>
                 *)(&log_destinations_ + severity);
      uVar5 = (ulong)severity;
      do {
        lVar4 = (long)fLI::FLAGS_logbuflevel;
        if ((this_00->_M_t).
            super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
            .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl ==
            (LogDestination *)0x0) {
          this = (LogDestination *)operator_new(0xd0);
          LogDestination(this,(LogSeverity)uVar5,(char *)0x0);
          local_38._M_head_impl = (LogDestination *)0x0;
          std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>
          ::reset(this_00,this);
          std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
          ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                       *)&local_38);
        }
        pLVar1 = ((this_00->_M_t).
                  super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
                  .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl)->logger_;
        (*pLVar1->_vptr_Logger[3])(pLVar1,(ulong)(lVar4 < (long)uVar5),timestamp,message,len);
        this_00 = this_00 + -1;
        bVar2 = 0 < (long)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar2);
    }
    return;
  }
  puVar3 = (undefined8 *)&stderr;
LAB_00110b76:
  ColoredWriteToStderrOrStdout((FILE *)*puVar3,severity,message,len);
  return;
}

Assistant:

inline void LogDestination::LogToAllLogfiles(
    LogSeverity severity,
    const std::chrono::system_clock::time_point& timestamp, const char* message,
    size_t len) {
  if (FLAGS_logtostdout) {  // global flag: never log to file
    ColoredWriteToStdout(severity, message, len);
  } else if (FLAGS_logtostderr) {  // global flag: never log to file
    ColoredWriteToStderr(severity, message, len);
  } else {
    for (int i = severity; i >= 0; --i) {
      LogDestination::MaybeLogToLogfile(static_cast<LogSeverity>(i), timestamp,
                                        message, len);
    }
  }
}